

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void quoteFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Mem *pVal;
  long lVar1;
  u8 uVar2;
  uint uVar3;
  uchar *puVar4;
  void *pvVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  double dVar9;
  StrAccum local_58;
  double local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.db = context->pOut->db;
  local_58.mxAlloc = (local_58.db)->aLimit[0];
  local_58.zText = (char *)0x0;
  local_58.nAlloc = 0;
  local_58.nChar = 0;
  local_58.accError = '\0';
  local_58.printfFlags = '\0';
  local_58._30_2_ = 0xaaaa;
  pVal = *argv;
  switch("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
         [pVal->flags & 0x3f]) {
  case '\x01':
    puVar4 = (uchar *)sqlite3VdbeIntValue(pVal);
    pcVar6 = "%lld";
    goto LAB_0019b615;
  case '\x02':
    local_38 = -NAN;
    dVar9 = sqlite3VdbeRealValue(pVal);
    sqlite3_str_appendf(&local_58,"%!0.15g");
    if ((local_58._24_8_ & 0xffffffff) != 0) {
      local_58.zText[local_58._24_8_ & 0xffffffff] = '\0';
      sqlite3AtoF(local_58.zText,&local_38,local_58.nChar,'\x01');
      if ((dVar9 != local_38) || (NAN(dVar9) || NAN(local_38))) {
        sqlite3_str_reset(&local_58);
        sqlite3_str_appendf(&local_58,"%!0.20e",dVar9);
      }
    }
    break;
  case '\x03':
    puVar4 = sqlite3_value_text(pVal);
    pcVar6 = "%Q";
LAB_0019b615:
    sqlite3_str_appendf(&local_58,pcVar6,puVar4);
    break;
  case '\x04':
    pvVar5 = sqlite3_value_blob(pVal);
    uVar3 = sqlite3_value_bytes(pVal);
    sqlite3StrAccumEnlarge(&local_58,(long)(int)uVar3 * 2 + 4);
    if (local_58.accError == '\0') {
      lVar1 = (long)(int)uVar3 * 2;
      uVar7 = 0;
      uVar8 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar8 = uVar7;
      }
      for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        local_58.zText[uVar7 * 2 + 2] = "0123456789ABCDEF"[*(byte *)((long)pvVar5 + uVar7) >> 4];
        local_58.zText[uVar7 * 2 + 3] = "0123456789ABCDEF"[*(byte *)((long)pvVar5 + uVar7) & 0xf];
      }
      (local_58.zText + lVar1 + 2)[0] = '\'';
      (local_58.zText + lVar1 + 2)[1] = '\0';
      local_58.zText[0] = 'X';
      local_58.zText[1] = '\'';
      local_58.nChar = (int)lVar1 + 3;
    }
    break;
  default:
    sqlite3_str_append(&local_58,"NULL",4);
  }
  pcVar6 = sqlite3StrAccumFinish(&local_58);
  sqlite3_result_text(context,pcVar6,local_58.nChar,sqlite3OomClear);
  uVar2 = local_58.accError;
  if (local_58.accError == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else {
    sqlite3_result_null(context);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      sqlite3_result_error_code(context,(uint)uVar2);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void quoteFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  sqlite3_str str;
  sqlite3 *db = sqlite3_context_db_handle(context);
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  sqlite3StrAccumInit(&str, db, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);
  sqlite3QuoteValue(&str,argv[0]);
  sqlite3_result_text(context, sqlite3StrAccumFinish(&str), str.nChar,
                      SQLITE_DYNAMIC);
  if( str.accError!=SQLITE_OK ){
    sqlite3_result_null(context);
    sqlite3_result_error_code(context, str.accError);
  }
}